

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# sqbaselib.cpp
# Opt level: O3

SQInteger base_assert(HSQUIRRELVM v)

{
  SQObjectType SVar1;
  bool bVar2;
  SQObjectPtr *pSVar3;
  SQInteger SVar4;
  SQRESULT SVar5;
  char *err;
  SQChar *str;
  SQChar *local_10;
  
  pSVar3 = SQVM::GetAt(v,v->_stackbase + 1);
  bVar2 = SQVM::IsFalse(pSVar3);
  if (!bVar2) {
    return 0;
  }
  SVar4 = sq_gettop(v);
  if (2 < SVar4) {
    pSVar3 = SQVM::GetAt(v,v->_stackbase + 2);
    SVar1 = (pSVar3->super_SQObject)._type;
    if ((SVar1 == OT_NATIVECLOSURE) || (SVar4 = 3, SVar1 == OT_CLOSURE)) {
      sq_pushroottable(v);
      SVar5 = sq_call(v,1,1,0);
      SVar4 = -1;
      if (SVar5 < 0) goto LAB_00120731;
    }
    SVar5 = sq_tostring(v,SVar4);
    if (-1 < SVar5) {
      local_10 = (SQChar *)0x0;
      SVar5 = sq_getstring(v,-1,&local_10);
      err = local_10;
      if (-1 < SVar5) goto LAB_00120738;
    }
  }
LAB_00120731:
  err = "assertion failed";
LAB_00120738:
  SVar5 = sq_throwerror(v,err);
  return SVar5;
}

Assistant:

static SQInteger base_assert(HSQUIRRELVM v)
{
    if(SQVM::IsFalse(stack_get(v,2))){
        if (sq_gettop(v) > 2) {
            SQObjectPtr &arg = stack_get(v,3);
            SQInteger msgIdx = 0;
            if (sq_type(arg)==OT_CLOSURE || sq_type(arg)==OT_NATIVECLOSURE) {
                sq_pushroottable(v);
                if (SQ_SUCCEEDED(sq_call(v, 1, SQTrue, SQFalse)))
                    msgIdx = -1;
            }
            else
                msgIdx = 3;

            if (msgIdx!=0 && SQ_SUCCEEDED(sq_tostring(v,msgIdx))) {
                const SQChar *str = 0;
                if (SQ_SUCCEEDED(sq_getstring(v,-1,&str)))
                    return sq_throwerror(v, str);
            }
        }

        return sq_throwerror(v, _SC("assertion failed"));
    }
    return 0;
}